

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Test.cpp
# Opt level: O2

void ShowDoubleArray(double *inDoubleArray,int inSize)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  
  std::operator<<((ostream *)&std::cout,"[ ");
  uVar3 = 0;
  uVar2 = (ulong)(uint)inSize;
  if (inSize < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    poVar1 = std::ostream::_M_insert<double>(inDoubleArray[uVar3]);
    std::operator<<(poVar1," ");
  }
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

static void ShowDoubleArray(const double inDoubleArray[],int inSize)
{
	cout<<"[ ";
	for(int i=0;i<inSize;++i)
		cout<<Double(inDoubleArray[i])<<" ";
	cout<<"]";
}